

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simpleformatter.h
# Opt level: O0

int32_t __thiscall icu_63::SimpleFormatter::getArgumentLimit(SimpleFormatter *this)

{
  int32_t iVar1;
  char16_t *compiledPattern;
  SimpleFormatter *this_local;
  
  compiledPattern = UnicodeString::getBuffer(&this->compiledPattern);
  iVar1 = UnicodeString::length(&this->compiledPattern);
  iVar1 = getArgumentLimit(compiledPattern,iVar1);
  return iVar1;
}

Assistant:

int32_t getArgumentLimit() const {
        return getArgumentLimit(compiledPattern.getBuffer(), compiledPattern.length());
    }